

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg)

{
  int *piVar1;
  undefined8 *puVar2;
  ImRect *pIVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ImGuiWindow *pIVar8;
  ImGuiWindow *pIVar9;
  ImGuiContext *pIVar10;
  bool bVar11;
  bool bVar12;
  ImGuiContext *g;
  long lVar13;
  uint uVar14;
  long lVar15;
  ImGuiWindow *window;
  float fVar16;
  float fVar17;
  ImVec2 IVar18;
  float fVar19;
  float fVar20;
  ImVec2 IVar21;
  ImVec2 IVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  ImVec2 local_28;
  undefined8 uStack_20;
  
  pIVar10 = GImGui;
  pIVar8 = GImGui->CurrentWindow;
  if (id == 0) goto LAB_00148be5;
  piVar1 = &(pIVar8->DC).NavLayerActiveMaskNext;
  *piVar1 = *piVar1 | (pIVar8->DC).NavLayerCurrentMask;
  uVar5 = pIVar10->NavId;
  if ((((uVar5 != id) && (pIVar10->NavAnyRequest != true)) ||
      (pIVar9 = pIVar10->NavWindow, pIVar9->RootWindowForNav != pIVar8->RootWindowForNav)) ||
     ((pIVar8 != pIVar9 && (((uint)(pIVar9->Flags | pIVar8->Flags) >> 0x17 & 1) == 0))))
  goto LAB_00148be5;
  if (nav_bb_arg == (ImRect *)0x0) {
    nav_bb_arg = bb;
  }
  uVar6 = (pIVar8->DC).ItemFlags;
  fVar19 = (pIVar8->Pos).x;
  fVar16 = (nav_bb_arg->Min).x - fVar19;
  fVar20 = (pIVar8->Pos).y;
  fVar17 = (nav_bb_arg->Min).y - fVar20;
  IVar18.x = (nav_bb_arg->Max).x - fVar19;
  IVar18.y = (nav_bb_arg->Max).y - fVar20;
  if ((pIVar10->NavInitRequest == true) && (pIVar10->NavLayer == (pIVar8->DC).NavLayerCurrent)) {
    if ((uVar6 & 0x10) == 0) {
      pIVar10->NavInitResultId = id;
      IVar21.y = fVar17;
      IVar21.x = fVar16;
      (pIVar10->NavInitResultRectRel).Min = IVar21;
      (pIVar10->NavInitResultRectRel).Max = IVar18;
      pIVar10->NavInitRequest = false;
      if (pIVar10->NavMoveRequest == false) {
        pIVar10->NavAnyRequest = false;
      }
      else {
        pIVar10->NavAnyRequest = true;
      }
    }
    else if (pIVar10->NavInitResultId == 0) {
      pIVar10->NavInitResultId = id;
      IVar22.y = fVar17;
      IVar22.x = fVar16;
      (pIVar10->NavInitResultRectRel).Min = IVar22;
      (pIVar10->NavInitResultRectRel).Max = IVar18;
    }
  }
  if ((uVar5 != id) && ((uVar6 & 8) == 0)) {
    lVar13 = 0x1b28;
    if (pIVar8 == pIVar9) {
      lVar13 = 0x1af8;
    }
    if ((pIVar10->NavMoveRequest == true) &&
       (iVar7 = pIVar10->NavLayer, iVar7 == (pIVar8->DC).NavLayerCurrent)) {
      fVar20 = (nav_bb_arg->Min).x;
      fVar19 = (nav_bb_arg->Min).y;
      local_28 = nav_bb_arg->Max;
      pIVar10->NavScoringCount = pIVar10->NavScoringCount + 1;
      uVar6 = pIVar10->NavMoveDir;
      if (uVar6 < 2) {
        fVar26 = (pIVar8->ClipRect).Min.y;
        fVar27 = (pIVar8->ClipRect).Max.y;
        fVar23 = fVar27;
        if (fVar19 <= fVar27) {
          fVar23 = fVar19;
        }
        fVar19 = (float)(-(uint)(fVar19 < fVar26) & (uint)fVar26 |
                        ~-(uint)(fVar19 < fVar26) & (uint)fVar23);
        lVar15 = 1;
      }
      else {
        fVar26 = (pIVar8->ClipRect).Min.x;
        fVar27 = (pIVar8->ClipRect).Max.x;
        fVar23 = fVar27;
        if (fVar20 <= fVar27) {
          fVar23 = fVar20;
        }
        fVar20 = (float)(-(uint)(fVar20 < fVar26) & (uint)fVar26 |
                        ~-(uint)(fVar20 < fVar26) & (uint)fVar23);
        lVar15 = 0;
      }
      uStack_20 = 0;
      fVar23 = (&local_28.x)[lVar15];
      if (fVar23 <= fVar27) {
        fVar27 = fVar23;
      }
      (&local_28.x)[lVar15] =
           (float)(-(uint)(fVar23 < fVar26) & (uint)fVar26 |
                  ~-(uint)(fVar23 < fVar26) & (uint)fVar27);
      fVar26 = (pIVar10->NavScoringRectScreen).Min.x;
      fVar27 = (pIVar10->NavScoringRectScreen).Max.x;
      if (fVar26 <= local_28.x) {
        fVar23 = 0.0;
        if (fVar27 < fVar20) {
          fVar23 = fVar20 - fVar27;
        }
      }
      else {
        fVar23 = local_28.x - fVar26;
      }
      fVar24 = (local_28.y - fVar19) * 0.8 + fVar19;
      fVar25 = (pIVar10->NavScoringRectScreen).Min.y;
      fVar4 = (pIVar10->NavScoringRectScreen).Max.y;
      fVar28 = fVar4 - fVar25;
      fVar29 = fVar28 * 0.2 + fVar25;
      if (fVar29 <= fVar24) {
        fVar24 = (local_28.y - fVar19) * 0.2 + fVar19;
        fVar28 = fVar28 * 0.8 + fVar25;
        if (fVar28 < fVar24) {
          fVar24 = fVar24 - fVar28;
          goto LAB_00148ebf;
        }
        fVar24 = 0.0;
        bVar11 = false;
      }
      else {
        fVar24 = fVar24 - fVar29;
LAB_00148ebf:
        bVar11 = fVar24 != 0.0;
        if (((fVar23 != 0.0) || (NAN(fVar23))) && ((fVar24 != 0.0 || (NAN(fVar24))))) {
          fVar23 = fVar23 / 1000.0 + *(float *)(&DAT_001a8a30 + (ulong)(0.0 < fVar23) * 4);
          bVar11 = true;
        }
      }
      fVar20 = (fVar20 + local_28.x) - (fVar26 + fVar27);
      fVar19 = (fVar19 + local_28.y) - (fVar25 + fVar4);
      fVar26 = ABS(fVar24) + ABS(fVar23);
      fVar27 = ABS(fVar20) + ABS(fVar19);
      if (bVar11) {
LAB_00148f8d:
        fVar25 = fVar26;
        uVar14 = (uint)(0.0 < fVar23);
        fVar20 = fVar23;
        fVar19 = fVar24;
        if (ABS(fVar23) <= ABS(fVar24)) {
          uVar14 = 0.0 < fVar24 | 2;
        }
      }
      else {
        if ((fVar23 != 0.0) || (NAN(fVar23))) goto LAB_00148f8d;
        if ((((fVar20 != 0.0) || (NAN(fVar20))) || (fVar19 != 0.0)) || (NAN(fVar19))) {
          fVar25 = fVar27;
          uVar14 = 0.0 < fVar19 | 2;
          if (ABS(fVar19) < ABS(fVar20)) {
            uVar14 = (uint)(0.0 < fVar20);
          }
        }
        else {
          fVar25 = 0.0;
          uVar14 = (uint)(uVar5 <= (pIVar8->DC).LastItemId);
          fVar20 = 0.0;
          fVar19 = 0.0;
        }
      }
      fVar4 = *(float *)((long)(pIVar10->IO).KeyMap + lVar13 + -0x2c);
      if (uVar14 != uVar6) goto LAB_00149050;
      if (fVar4 <= fVar26) {
        if ((fVar26 != fVar4) || (NAN(fVar26) || NAN(fVar4))) {
LAB_00149050:
          bVar11 = false;
        }
        else {
          fVar26 = *(float *)((long)(pIVar10->IO).KeyMap + lVar13 + -0x28);
          if (fVar26 <= fVar27) {
            if ((fVar27 == fVar26) && (!NAN(fVar27) && !NAN(fVar26))) {
              if ((uVar6 & 0xfffffffe) != 2) {
                fVar24 = fVar23;
              }
              if (fVar24 < 0.0) goto LAB_0014904b;
            }
            goto LAB_00149050;
          }
          *(float *)((long)(pIVar10->IO).KeyMap + lVar13 + -0x28) = fVar27;
LAB_0014904b:
          bVar11 = true;
        }
        if (((((fVar4 != 3.4028235e+38) || (NAN(fVar4))) || (iVar7 != 1)) ||
            ((*(float *)((long)(pIVar10->IO).KeyMap + lVar13 + -0x24) <= fVar25 ||
             ((pIVar9->Flags & 0x10000000) != 0)))) ||
           (((((uVar6 != 0 || (0.0 <= fVar20)) && ((uVar6 != 1 || (fVar20 <= 0.0)))) &&
             ((uVar6 != 2 || (0.0 <= fVar19)))) && ((uVar6 != 3 || (fVar19 <= 0.0)))))) {
          if (!bVar11) goto LAB_001490e9;
        }
        else {
          *(float *)((long)(pIVar10->IO).KeyMap + lVar13 + -0x24) = fVar25;
        }
      }
      else {
        *(ulong *)((long)(pIVar10->IO).KeyMap + lVar13 + -0x2c) = CONCAT44(fVar27,fVar26);
      }
      *(ImGuiID *)((long)(pIVar10->IO).KeyMap + lVar13 + -0x3c) = id;
      lVar15 = (long)(pIVar8->IDStack).Size;
      if (lVar15 < 1) {
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.h"
                      ,0x4a4,"value_type &ImVector<unsigned int>::back() [T = unsigned int]");
      }
      *(uint *)((long)(pIVar10->IO).KeyMap + lVar13 + -0x38) = (pIVar8->IDStack).Data[lVar15 + -1];
      *(ImGuiWindow **)((long)(pIVar10->IO).KeyMap + lVar13 + -0x34) = pIVar8;
      puVar2 = (undefined8 *)((long)(pIVar10->IO).KeyMap + lVar13 + -0x20);
      *puVar2 = CONCAT44(fVar17,fVar16);
      *(ImVec2 *)(puVar2 + 1) = IVar18;
    }
  }
LAB_001490e9:
  if (uVar5 == id) {
    pIVar10->NavWindow = pIVar8;
    iVar7 = (pIVar8->DC).NavLayerCurrent;
    pIVar10->NavLayer = iVar7;
    pIVar10->NavIdIsAlive = true;
    pIVar10->NavIdTabCounter = pIVar8->FocusIdxTabCounter;
    pIVar3 = pIVar8->NavRectRel + iVar7;
    (pIVar3->Min).x = fVar16;
    (pIVar3->Min).y = fVar17;
    (pIVar3->Max).x = IVar18.x;
    (pIVar3->Max).y = IVar18.y;
  }
LAB_00148be5:
  (pIVar8->DC).LastItemId = id;
  IVar18 = bb->Max;
  (pIVar8->DC).LastItemRect.Min = bb->Min;
  (pIVar8->DC).LastItemRect.Max = IVar18;
  (pIVar8->DC).LastItemStatusFlags = 0;
  bVar11 = IsClippedEx(bb,id,false);
  if ((!bVar11) && (bVar12 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar12)) {
    (pIVar8->DC).LastItemStatusFlags = 1;
  }
  return !bVar11;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (id != 0)
    {
        // Navigation processing runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests unfortunately, but it is still limited to one window. 
        //      it may not scale very well for windows with ten of thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick)
        window->DC.NavLayerActiveMaskNext |= window->DC.NavLayerCurrentMask;
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem(window, nav_bb_arg ? *nav_bb_arg : bb, id);
    }

    window->DC.LastItemId = id;
    window->DC.LastItemRect = bb;
    window->DC.LastItemStatusFlags = 0;

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id, false);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}